

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device7.c
# Opt level: O2

void device6(void *arg)

{
  int line;
  int line_00;
  int iVar1;
  char *in_RCX;
  int sock;
  int sock_00;
  
  line = test_socket_impl((char *)0x42,2,0x31,(int)in_RCX);
  test_connect_impl((char *)0x43,line,0x102176,in_RCX);
  line_00 = test_socket_impl((char *)0x44,2,0x30,(int)in_RCX);
  test_bind_impl((char *)0x45,line_00,0x104180,in_RCX);
  iVar1 = nn_device(line,line_00);
  if (iVar1 < 0) {
    iVar1 = nn_errno();
    if (iVar1 == 0x9523dfd) {
      test_close_impl((char *)0x4c,line,sock);
      test_close_impl((char *)0x4d,line_00,sock_00);
      return;
    }
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0 && nn_errno () == ETERM",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device7.c",
          0x49);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void device6 (NN_UNUSED void *arg)
{
    int rc;
    int dev2;
    int dev3;

    dev2 = test_socket (AF_SP_RAW, NN_REP);
    test_connect (dev2, SOCKET_ADDRESS_I);
    dev3 = test_socket (AF_SP_RAW, NN_REQ);
    test_bind (dev3, socket_address_j);

    /*  Run the device. */
    rc = nn_device (dev2, dev3);
    nn_assert (rc < 0 && nn_errno () == ETERM);

    /*  Clean up. */
    test_close (dev2);
    test_close (dev3);
}